

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

qlonglong __thiscall QByteArray::toLongLong(QByteArray *this,bool *ok,int base)

{
  longlong lVar1;
  undefined4 in_EDX;
  bool *in_RSI;
  int in_stack_0000002c;
  undefined1 in_stack_00000030 [16];
  undefined4 in_stack_ffffffffffffffe8;
  
  qToByteArrayViewIgnoringNull<QByteArray,_true>
            ((QByteArray *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  lVar1 = QtPrivate::toIntegral<long_long,QByteArrayView,void>
                    ((QByteArrayView)in_stack_00000030,in_RSI,in_stack_0000002c);
  return lVar1;
}

Assistant:

qlonglong QByteArray::toLongLong(bool *ok, int base) const
{
    return QtPrivate::toIntegral<qlonglong>(qToByteArrayViewIgnoringNull(*this), ok, base);
}